

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O2

void * Dsm_ManDeriveGia(void *pGia,int fUseMuxes)

{
  ulong uVar1;
  Vec_Int_t *p;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Vec_Int_t *pVVar7;
  uint *puVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *p_01;
  int *piVar11;
  word *pTruth;
  Gia_Man_t *pGVar12;
  long lVar13;
  int iVar14;
  
  if (*(long *)((long)pGia + 0x108) == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                  ,0x1ff,"void *Dsm_ManDeriveGia(void *, int)");
  }
  p_00 = Gia_ManStart((*(int *)((long)pGia + 0x18) * 6) / 5 + 100);
  pcVar6 = Abc_UtilStrsav(*pGia);
  p_00->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(*(char **)((long)pGia + 8));
  p_00->pSpec = pcVar6;
  iVar14 = (*(int *)((long)pGia + 0x18) * 6) / 5 + 100;
  pVVar7 = Vec_IntAlloc(iVar14);
  pVVar7->nSize = iVar14;
  if (pVVar7->pArray != (int *)0x0) {
    memset(pVVar7->pArray,0,(long)iVar14 << 2);
  }
  p_00->vLevels = pVVar7;
  if (fUseMuxes != 0) {
    puVar8 = (uint *)calloc((long)p_00->nObjsAlloc,4);
    p_00->pMuxes = puVar8;
  }
  Gia_ManFillValue((Gia_Man_t *)pGia);
  *(undefined4 *)(*(long *)((long)pGia + 0x20) + 8) = 0;
  for (iVar14 = 0; iVar14 < (*(Vec_Int_t **)((long)pGia + 0x40))->nSize; iVar14 = iVar14 + 1) {
    iVar2 = Vec_IntEntry(*(Vec_Int_t **)((long)pGia + 0x40),iVar14);
    pGVar9 = Gia_ManObj((Gia_Man_t *)pGia,iVar2);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    pGVar10 = Gia_ManAppendObj(p_00);
    uVar1 = *(ulong *)pGVar10;
    *(ulong *)pGVar10 = uVar1 | 0x9fffffff;
    *(ulong *)pGVar10 =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar7 = p_00->vCis;
    iVar2 = Gia_ObjId(p_00,pGVar10);
    Vec_IntPush(pVVar7,iVar2);
    iVar2 = Gia_ObjId(p_00,pGVar10);
    pGVar9->Value = iVar2 * 2;
  }
  pVVar7 = Vec_IntAlloc(0x10);
  p_01 = Vec_IntAlloc(0x10000);
  Gia_ManHashStart(p_00);
  iVar14 = Gia_ManLutSizeMax((Gia_Man_t *)pGia);
  Gia_ObjComputeTruthTableStart((Gia_Man_t *)pGia,iVar14);
  for (iVar14 = 0; iVar14 < *(int *)((long)pGia + 0x18); iVar14 = iVar14 + 1) {
    pGVar9 = Gia_ManObj((Gia_Man_t *)pGia,iVar14);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
      iVar2 = Gia_ObjIsBuf(pGVar9);
      if (iVar2 == 0) {
        iVar2 = Vec_IntEntry(*(Vec_Int_t **)((long)pGia + 0x108),iVar14);
        if (iVar2 == 0) goto LAB_00438fe0;
        pVVar7->nSize = 0;
        lVar13 = 0;
        while( true ) {
          iVar2 = Gia_ObjLutSize((Gia_Man_t *)pGia,iVar14);
          if (iVar2 <= lVar13) break;
          piVar11 = Gia_ObjLutFanins((Gia_Man_t *)pGia,iVar14);
          Vec_IntPush(pVVar7,piVar11[lVar13]);
          lVar13 = lVar13 + 1;
        }
        pGVar9 = Gia_ManObj((Gia_Man_t *)pGia,iVar14);
        pTruth = Gia_ObjComputeTruthTableCut((Gia_Man_t *)pGia,pGVar9,pVVar7);
        pVVar7->nSize = 0;
        lVar13 = 0;
        while( true ) {
          iVar2 = Gia_ObjLutSize((Gia_Man_t *)pGia,iVar14);
          if (iVar2 <= lVar13) break;
          piVar11 = Gia_ObjLutFanins((Gia_Man_t *)pGia,iVar14);
          pGVar9 = Gia_ManObj((Gia_Man_t *)pGia,piVar11[lVar13]);
          Vec_IntPush(pVVar7,pGVar9->Value);
          lVar13 = lVar13 + 1;
        }
        uVar5 = Dsm_ManTruthToGia(p_00,pTruth,pVVar7,p_01);
        pGVar9 = Gia_ManObj((Gia_Man_t *)pGia,iVar14);
      }
      else {
        iVar2 = Gia_ObjFanin0Copy(pGVar9);
        pGVar10 = Gia_ManAppendObj(p_00);
        iVar3 = Abc_Lit2Var(iVar2);
        if (p_00->nObjs <= iVar3) {
          __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x30c,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
        }
        iVar3 = Gia_ObjId(p_00,pGVar10);
        iVar4 = Abc_Lit2Var(iVar2);
        *(ulong *)pGVar10 =
             CONCAT44(iVar3 - iVar4,iVar3 - iVar4) & 0x1fffffff1fffffff |
             *(ulong *)pGVar10 & 0xe0000000e0000000;
        uVar5 = Abc_LitIsCompl(iVar2);
        *(ulong *)pGVar10 =
             (ulong)(uVar5 << 0x1d) | *(ulong *)pGVar10 & 0xdfffffffdfffffff | (ulong)uVar5 << 0x3d;
        p_00->nBufs = p_00->nBufs + 1;
        iVar2 = Gia_ObjId(p_00,pGVar10);
        uVar5 = iVar2 * 2;
      }
      pGVar9->Value = uVar5;
    }
LAB_00438fe0:
  }
  Gia_ObjComputeTruthTableStop((Gia_Man_t *)pGia);
  for (iVar14 = 0; iVar14 < (*(Vec_Int_t **)((long)pGia + 0x48))->nSize; iVar14 = iVar14 + 1) {
    iVar2 = Vec_IntEntry(*(Vec_Int_t **)((long)pGia + 0x48),iVar14);
    pGVar9 = Gia_ManObj((Gia_Man_t *)pGia,iVar2);
    if (pGVar9 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar9);
    iVar3 = Abc_Lit2Var(iVar2);
    if (p_00->nObjs <= iVar3) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    iVar3 = Abc_Lit2Var(iVar2);
    pGVar10 = Gia_ManObj(p_00,iVar3);
    if ((~*(uint *)pGVar10 & 0x1fffffff) != 0 && (int)*(uint *)pGVar10 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar10 = Gia_ManAppendObj(p_00);
    *(ulong *)pGVar10 = *(ulong *)pGVar10 | 0x80000000;
    iVar3 = Gia_ObjId(p_00,pGVar10);
    iVar4 = Abc_Lit2Var(iVar2);
    *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xffffffffe0000000 | (ulong)(iVar3 - iVar4 & 0x1fffffff)
    ;
    iVar2 = Abc_LitIsCompl(iVar2);
    uVar1 = *(ulong *)pGVar10;
    *(ulong *)pGVar10 = uVar1 & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
    *(ulong *)pGVar10 =
         uVar1 & 0xe0000000dfffffff | (ulong)(uint)(iVar2 << 0x1d) |
         (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
    p = p_00->vCos;
    iVar2 = Gia_ObjId(p_00,pGVar10);
    Vec_IntPush(p,iVar2);
    if (p_00->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_00,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),pGVar10);
    }
    iVar2 = Gia_ObjId(p_00,pGVar10);
    pGVar9->Value = iVar2 * 2;
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,*(int *)((long)pGia + 0x10));
  Vec_IntFree(pVVar7);
  Vec_IntFree(p_01);
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

void * Dsm_ManDeriveGia( void * pGia, int fUseMuxes )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vCover, * vLeaves;
    Gia_Obj_t * pObj; 
    int k, i, iLut, iVar;
    word * pTruth;
    assert( Gia_ManHasMapping(p) );   
    // create new manager
    pNew = Gia_ManStart( 6*Gia_ManObjNum(p)/5 + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->vLevels = Vec_IntStart( 6*Gia_ManObjNum(p)/5 + 100 );
    if ( fUseMuxes )
        pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    // map primary inputs
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // iterate through nodes used in the mapping
    vLeaves = Vec_IntAlloc( 16 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    Gia_ManHashStart( pNew );
    Gia_ObjComputeTruthTableStart( p, Gia_ManLutSizeMax(p) );
    Gia_ManForEachAnd( p, pObj, iLut )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
            continue;
        }
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        // collect leaves
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, iLut, iVar, k )
            Vec_IntPush( vLeaves, iVar );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, iLut), vLeaves );
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, iLut, iVar, k )
            Vec_IntPush( vLeaves, Gia_ManObj(p, iVar)->Value );
        Gia_ManObj(p, iLut)->Value = Dsm_ManTruthToGia( pNew, pTruth, vLeaves, vCover );
    }
    Gia_ObjComputeTruthTableStop( p );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
/*
    Gia_ManForEachAnd( pNew, pObj, i )
    {
        int iLev  = Gia_ObjLevelId(pNew, i);
        int iLev0 = Gia_ObjLevelId(pNew, Gia_ObjFaninId0(pObj, i));
        int iLev1 = Gia_ObjLevelId(pNew, Gia_ObjFaninId1(pObj, i));
        assert( iLev == 1 + Abc_MaxInt(iLev0, iLev1) );
    }
*/
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}